

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

LinearSpace3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,size_t primID,BBox1f time_range)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  BBox1f BVar5;
  uint uVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  float fVar13;
  vfloat4 a0;
  float fVar14;
  float fVar17;
  float fVar18;
  vfloat4 b1;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar26 [16];
  vfloat4 a;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  vfloat4 a_1;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar38 [16];
  
  BVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  fVar30 = BVar5.lower;
  fVar13 = BVar5.upper;
  fVar28 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  auVar16._4_4_ = fVar13;
  auVar16._0_4_ = fVar13;
  auVar16._8_4_ = fVar13;
  auVar16._12_4_ = fVar13;
  auVar15._4_12_ = auVar16._4_12_;
  auVar15._0_4_ = fVar13 - fVar30;
  fVar22 = (time_range.upper - fVar30) / auVar15._0_4_;
  fVar13 = floorf(((time_range.lower - fVar30) / auVar15._0_4_) * 1.0000002 * fVar28);
  fVar30 = 0.0;
  if (0.0 <= fVar13) {
    fVar30 = fVar13;
  }
  fVar13 = ceilf(fVar22 * 0.99999976 * fVar28);
  if (fVar28 <= fVar13) {
    fVar13 = fVar28;
  }
  if ((int)fVar13 == (int)fVar30) {
    auVar16 = rsqrtss(auVar15,0x3f800000);
    fVar28 = auVar16._0_4_;
    fVar19 = fVar28 * 1.5 - fVar28 * fVar28 * fVar28 * 0.5;
    fVar14 = fVar19 * -1.0;
    fVar17 = fVar19 * 0.0;
    fVar18 = fVar19 * 0.0;
    fVar19 = fVar19 * 0.0;
    fVar23 = fVar17 * 0.0 + fVar14 * -0.0;
    fVar27 = fVar18 * 0.0 + fVar17 * -1.0;
    fVar29 = fVar14 * 1.0 + fVar18 * -0.0;
    fVar13 = fVar19 * 0.0 + fVar19 * -0.0;
    fVar28 = fVar27 * fVar27;
    fVar30 = fVar29 * fVar29;
    fVar22 = fVar13 * fVar13;
    fVar37 = fVar30 + fVar28 + fVar23 * fVar23;
    auVar38._0_8_ = CONCAT44(fVar22 + fVar28 + fVar28,fVar37);
    auVar38._8_4_ = fVar30 + fVar28 + fVar30;
    auVar38._12_4_ = fVar22 + fVar28 + fVar22;
    auVar24._8_4_ = auVar38._8_4_;
    auVar24._0_8_ = auVar38._0_8_;
    auVar24._12_4_ = auVar38._12_4_;
    auVar16 = rsqrtss(auVar24,auVar38);
    fVar28 = auVar16._0_4_;
    fVar37 = fVar28 * 1.5 - fVar28 * fVar28 * fVar37 * 0.5 * fVar28;
    fVar27 = fVar37 * fVar27;
    fVar29 = fVar37 * fVar29;
    fVar23 = fVar37 * fVar23;
    fVar37 = fVar37 * fVar13;
    fVar28 = 0.0;
    fVar30 = 0.0;
    fVar13 = 1.0;
    fVar22 = 0.0;
  }
  else {
    iVar12 = ((int)fVar30 + (int)fVar13) / 2;
    pBVar7 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    uVar6 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->
                                        super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar8 = pBVar7[iVar12].super_RawBufferView.ptr_ofs;
    sVar9 = pBVar7[iVar12].super_RawBufferView.stride;
    pfVar1 = (float *)(pcVar8 + (uVar6 + 1) * sVar9);
    pfVar2 = (float *)(pcVar8 + (uVar6 + 2) * sVar9);
    fVar23 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             maxRadiusScale;
    fVar28 = *pfVar2 - *pfVar1;
    fVar30 = pfVar2[1] - pfVar1[1];
    fVar13 = pfVar2[2] - pfVar1[2];
    fVar37 = pfVar2[3] * fVar23 - pfVar1[3] * fVar23;
    fVar22 = fVar30 * fVar30;
    fVar27 = fVar13 * fVar13;
    fVar29 = fVar37 * fVar37;
    fVar17 = fVar22 + fVar28 * fVar28 + fVar27;
    auVar34._0_8_ = CONCAT44(fVar22 + fVar22 + fVar29,fVar17);
    auVar34._8_4_ = fVar22 + fVar27 + fVar27;
    auVar34._12_4_ = fVar22 + fVar29 + fVar29;
    auVar39._8_4_ = auVar34._8_4_;
    auVar39._0_8_ = auVar34._0_8_;
    auVar39._12_4_ = auVar34._12_4_;
    auVar16 = rsqrtss(auVar39,auVar34);
    fVar22 = auVar16._0_4_;
    fVar22 = fVar22 * 1.5 - fVar22 * fVar22 * fVar17 * 0.5 * fVar22;
    fVar28 = fVar22 * fVar28;
    fVar30 = fVar22 * fVar30;
    fVar13 = fVar22 * fVar13;
    fVar22 = fVar22 * fVar37;
    if (1e-18 < fVar17) {
      pfVar3 = (float *)(pcVar8 + uVar6 * sVar9);
      pfVar4 = (float *)(pcVar8 + (uVar6 + 3) * sVar9);
      fVar29 = (*pfVar1 * 0.0 + *pfVar2 * 0.5 + *pfVar4 * 0.0) - *pfVar3 * 0.5;
      fVar27 = (pfVar1[1] * 0.0 + pfVar2[1] * 0.5 + pfVar4[1] * 0.0) - pfVar3[1] * 0.5;
      fVar37 = (pfVar1[2] * 0.0 + pfVar2[2] * 0.5 + pfVar4[2] * 0.0) - pfVar3[2] * 0.5;
      fVar17 = (pfVar1[3] * fVar23 * 0.0 + pfVar2[3] * fVar23 * 0.5 + pfVar4[3] * fVar23 * 0.0) -
               pfVar3[3] * fVar23 * 0.5;
      fVar23 = fVar27 * fVar28 - fVar30 * fVar29;
      fVar27 = fVar37 * fVar30 - fVar13 * fVar27;
      fVar29 = fVar29 * fVar13 - fVar28 * fVar37;
      fVar37 = fVar17 * fVar22 - fVar22 * fVar17;
    }
    else {
      fVar27 = 0.0;
      fVar29 = 1.0;
      fVar23 = 0.0;
      fVar37 = 0.0;
      fVar28 = 0.0;
      fVar30 = 0.0;
      fVar13 = 1.0;
      fVar22 = 0.0;
    }
    fVar17 = fVar29 * fVar29;
    fVar19 = fVar23 * fVar23;
    fVar14 = fVar37 * fVar37;
    fVar18 = fVar17 + fVar27 * fVar27 + fVar19;
    auVar25._0_8_ = CONCAT44(fVar17 + fVar17 + fVar14,fVar18);
    auVar25._8_4_ = fVar17 + fVar19 + fVar19;
    auVar25._12_4_ = fVar17 + fVar14 + fVar14;
    if (fVar18 <= 1e-18) {
      fVar23 = -fVar30;
      fVar14 = -fVar13;
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      if (fVar23 * fVar23 + fVar13 * fVar13 + 0.0 <= fVar28 * fVar28 + fVar14 * fVar14 + 0.0) {
        auVar20 = SUB1612((undefined1  [16])0x0,0);
      }
      fVar17 = (float)((uint)fVar13 & auVar20._4_4_);
      fVar14 = (float)(~auVar20._0_4_ & (uint)fVar14);
      fVar18 = (float)(~auVar20._8_4_ & (uint)fVar28 | (uint)fVar23 & auVar20._8_4_);
      fVar23 = fVar17 * fVar17;
      fVar27 = fVar18 * fVar18;
      fVar29 = fVar23 + fVar14 * fVar14 + fVar27;
      auVar36._0_8_ = CONCAT44(fVar23 + fVar23 + 0.0,fVar29);
      auVar36._8_4_ = fVar23 + fVar27 + fVar27;
      auVar36._12_4_ = fVar23 + 0.0 + 0.0;
      auVar40._8_4_ = auVar36._8_4_;
      auVar40._0_8_ = auVar36._0_8_;
      auVar40._12_4_ = auVar36._12_4_;
      auVar16 = rsqrtss(auVar40,auVar36);
      fVar23 = auVar16._0_4_;
      fVar19 = fVar23 * 1.5 - fVar23 * fVar23 * fVar29 * 0.5 * fVar23;
      fVar14 = fVar19 * fVar14;
      fVar17 = fVar19 * fVar17;
      fVar18 = fVar19 * fVar18;
      fVar19 = fVar19 * 0.0;
      fVar23 = fVar17 * fVar28 - fVar30 * fVar14;
      fVar27 = fVar18 * fVar30 - fVar13 * fVar17;
      fVar29 = fVar14 * fVar13 - fVar28 * fVar18;
      fVar32 = fVar19 * fVar22 - fVar22 * fVar19;
      fVar37 = fVar27 * fVar27;
      fVar31 = fVar29 * fVar29;
      fVar33 = fVar32 * fVar32;
      fVar41 = fVar31 + fVar37 + fVar23 * fVar23;
      fVar42 = fVar33 + fVar37 + fVar37;
      fVar31 = fVar31 + fVar37 + fVar31;
      fVar33 = fVar33 + fVar37 + fVar33;
      auVar21._4_4_ = fVar42;
      auVar21._0_4_ = fVar41;
      auVar21._8_4_ = fVar31;
      auVar21._12_4_ = fVar33;
      auVar11._4_4_ = fVar42;
      auVar11._0_4_ = fVar41;
      auVar11._8_4_ = fVar31;
      auVar11._12_4_ = fVar33;
      auVar16 = rsqrtss(auVar21,auVar11);
      fVar37 = auVar16._0_4_;
      fVar37 = fVar37 * 1.5 - fVar37 * fVar37 * fVar41 * 0.5 * fVar37;
      fVar27 = fVar37 * fVar27;
      fVar29 = fVar37 * fVar29;
      fVar23 = fVar37 * fVar23;
      fVar37 = fVar37 * fVar32;
    }
    else {
      auVar35._8_4_ = auVar25._8_4_;
      auVar35._0_8_ = auVar25._0_8_;
      auVar35._12_4_ = auVar25._12_4_;
      auVar16 = rsqrtss(auVar35,auVar25);
      fVar17 = auVar16._0_4_;
      fVar17 = fVar17 * 1.5 - fVar17 * fVar17 * fVar18 * 0.5 * fVar17;
      fVar27 = fVar27 * fVar17;
      fVar29 = fVar29 * fVar17;
      fVar23 = fVar23 * fVar17;
      fVar37 = fVar37 * fVar17;
      fVar18 = fVar30 * fVar27 - fVar29 * fVar28;
      fVar14 = fVar13 * fVar29 - fVar23 * fVar30;
      fVar17 = fVar28 * fVar23 - fVar27 * fVar13;
      fVar32 = fVar22 * fVar37 - fVar37 * fVar22;
      fVar19 = fVar14 * fVar14;
      fVar31 = fVar17 * fVar17;
      fVar33 = fVar32 * fVar32;
      fVar41 = fVar31 + fVar19 + fVar18 * fVar18;
      fVar42 = fVar33 + fVar19 + fVar19;
      fVar31 = fVar31 + fVar19 + fVar31;
      fVar33 = fVar33 + fVar19 + fVar33;
      auVar26._4_4_ = fVar42;
      auVar26._0_4_ = fVar41;
      auVar26._8_4_ = fVar31;
      auVar26._12_4_ = fVar33;
      auVar10._4_4_ = fVar42;
      auVar10._0_4_ = fVar41;
      auVar10._8_4_ = fVar31;
      auVar10._12_4_ = fVar33;
      auVar16 = rsqrtss(auVar26,auVar10);
      fVar19 = auVar16._0_4_;
      fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * fVar41 * 0.5 * fVar19;
      fVar14 = fVar19 * fVar14;
      fVar17 = fVar19 * fVar17;
      fVar18 = fVar19 * fVar18;
      fVar19 = fVar19 * fVar32;
    }
  }
  (__return_storage_ptr__->vx).field_0.m128[0] = fVar14;
  (__return_storage_ptr__->vx).field_0.m128[1] = fVar17;
  (__return_storage_ptr__->vx).field_0.m128[2] = fVar18;
  (__return_storage_ptr__->vx).field_0.m128[3] = fVar19;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar27;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar29;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar23;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar37;
  (__return_storage_ptr__->vz).field_0.m128[0] = fVar28;
  (__return_storage_ptr__->vz).field_0.m128[1] = fVar30;
  (__return_storage_ptr__->vz).field_0.m128[2] = fVar13;
  (__return_storage_ptr__->vz).field_0.m128[3] = fVar22;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }